

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O0

Error asmjit::_abi_1_10::arm::FormatterInternal::formatFeature(String *sb,uint32_t featureId)

{
  Error EVar1;
  uint in_ESI;
  char *in_RDI;
  uint uVar2;
  
  uVar2 = 0x41;
  Support::min<unsigned_int>((uint *)&stack0xfffffffffffffff4,(uint *)&stack0xfffffffffffffff0);
  EVar1 = String::append((String *)CONCAT44(in_ESI,uVar2),in_RDI,0x154888);
  return EVar1;
}

Assistant:

Error FormatterInternal::formatFeature(String& sb, uint32_t featureId) noexcept {
  // @EnumStringBegin{"enum": "CpuFeatures::ARM", "output": "sFeature", "strip": "k"}@
  static const char sFeatureString[] =
    "None\0"
    "THUMB\0"
    "THUMBv2\0"
    "ARMv6\0"
    "ARMv7\0"
    "ARMv8a\0"
    "ARMv8_1a\0"
    "ARMv8_2a\0"
    "ARMv8_3a\0"
    "ARMv8_4a\0"
    "ARMv8_5a\0"
    "ARMv8_6a\0"
    "ARMv8_7a\0"
    "VFPv2\0"
    "VFPv3\0"
    "VFPv4\0"
    "VFP_D32\0"
    "AES\0"
    "ALTNZCV\0"
    "ASIMD\0"
    "BF16\0"
    "BTI\0"
    "CPUID\0"
    "CRC32\0"
    "DGH\0"
    "DIT\0"
    "DOTPROD\0"
    "EDSP\0"
    "FCMA\0"
    "FJCVTZS\0"
    "FLAGM\0"
    "FP16CONV\0"
    "FP16FML\0"
    "FP16FULL\0"
    "FRINT\0"
    "I8MM\0"
    "IDIVA\0"
    "IDIVT\0"
    "LSE\0"
    "MTE\0"
    "RCPC_IMMO\0"
    "RDM\0"
    "PMU\0"
    "PMULL\0"
    "RNG\0"
    "SB\0"
    "SHA1\0"
    "SHA2\0"
    "SHA3\0"
    "SHA512\0"
    "SM3\0"
    "SM4\0"
    "SSBS\0"
    "SVE\0"
    "SVE_BF16\0"
    "SVE_F32MM\0"
    "SVE_F64MM\0"
    "SVE_I8MM\0"
    "SVE_PMULL\0"
    "SVE2\0"
    "SVE2_AES\0"
    "SVE2_BITPERM\0"
    "SVE2_SHA3\0"
    "SVE2_SM4\0"
    "TME\0"
    "<Unknown>\0";

  static const uint16_t sFeatureIndex[] = {
    0, 5, 11, 19, 25, 31, 38, 47, 56, 65, 74, 83, 92, 101, 107, 113, 119, 127,
    131, 139, 145, 150, 154, 160, 166, 170, 174, 182, 187, 192, 200, 206, 215,
    223, 232, 238, 243, 249, 255, 259, 263, 273, 277, 281, 287, 291, 294, 299,
    304, 309, 316, 320, 324, 329, 333, 342, 352, 362, 371, 381, 386, 395, 408,
    418, 427, 431
  };
  // @EnumStringEnd@

  return sb.append(sFeatureString + sFeatureIndex[Support::min<uint32_t>(featureId, uint32_t(CpuFeatures::ARM::kMaxValue) + 1)]);
}